

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O2

void __thiscall Party::RefreshMembers(Party *this,Character *character,bool create)

{
  pointer ppCVar1;
  Character *this_00;
  PacketAction action;
  int iVar2;
  undefined7 in_register_00000011;
  pointer ppCVar3;
  PacketBuilder builder;
  string local_50;
  
  action = PACKET_LIST;
  if ((int)CONCAT71(in_register_00000011,create) != 0) {
    action = PACKET_CREATE;
  }
  PacketBuilder::PacketBuilder
            (&builder,PACKET_PARTY,action,
             ((long)(this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x12);
  ppCVar1 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1; ppCVar3 = ppCVar3 + 1
      ) {
    this_00 = *ppCVar3;
    iVar2 = Character::PlayerID(this_00);
    PacketBuilder::AddShort(&builder,iVar2);
    PacketBuilder::AddChar(&builder,(uint)(this_00 == this->leader));
    PacketBuilder::AddChar(&builder,(uint)this_00->level);
    iVar2 = (int)(((double)this_00->hp / (double)this_00->maxhp) * 100.0);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    if (99 < iVar2) {
      iVar2 = 100;
    }
    PacketBuilder::AddChar(&builder,iVar2);
    (*(this_00->super_Command_Source)._vptr_Command_Source[2])(&local_50,this_00);
    PacketBuilder::AddBreakString(&builder,&local_50,0xff);
    std::__cxx11::string::~string((string *)&local_50);
  }
  Character::Send(character,&builder);
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Party::RefreshMembers(Character *character, bool create)
{
	PacketBuilder builder(PACKET_PARTY, create ? PACKET_CREATE : PACKET_LIST, this->members.size() * 18);

	UTIL_FOREACH(this->members, member)
	{
		builder.AddShort(member->PlayerID());
		builder.AddChar(member == this->leader);
		builder.AddChar(member->level);
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddBreakString(member->SourceName());
	}

	character->Send(builder);
}